

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddTargetDepend
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,bool linking)

{
  bool bVar1;
  TargetType TVar2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *this_00;
  reference pcVar3;
  pointer ppVar4;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_01;
  bool local_85;
  int local_84;
  iterator iStack_80;
  int dependee_index;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_78;
  iterator local_70;
  _Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_> local_68;
  const_iterator tii;
  cmGeneratorTarget *transitive_dependee;
  cmLinkItem *i;
  iterator __end2;
  iterator __begin2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *__range2;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *utils;
  bool linking_local;
  cmListFileBacktrace *dependee_backtrace_local;
  cmGeneratorTarget *dependee_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  dependee_backtrace_local = (cmListFileBacktrace *)dependee;
  dependee_local._4_4_ = depender_index;
  pcStack_10 = this;
  bVar1 = cmGeneratorTarget::IsImported(dependee);
  if ((bVar1) ||
     (TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)dependee_backtrace_local),
     TVar2 == INTERFACE_LIBRARY)) {
    this_00 = cmGeneratorTarget::GetUtilityItems((cmGeneratorTarget *)dependee_backtrace_local);
    __end2 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::begin
                       (this_00);
    i = (cmLinkItem *)
        std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::end(this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&i), bVar1) {
      pcVar3 = std::_Rb_tree_const_iterator<cmLinkItem>::operator*(&__end2);
      tii._M_node = (_Base_ptr)pcVar3->Target;
      if ((cmGeneratorTarget *)tii._M_node != (cmGeneratorTarget *)0x0) {
        AddTargetDepend(this,dependee_local._4_4_,(cmGeneratorTarget *)tii._M_node,
                        &pcVar3->Backtrace,false);
      }
      std::_Rb_tree_const_iterator<cmLinkItem>::operator++(&__end2);
    }
  }
  else {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
         ::find(&this->TargetIndex,(key_type *)&dependee_backtrace_local);
    std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
    _Rb_tree_const_iterator(&local_68,&local_70);
    iStack_80 = std::
                map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                ::end(&this->TargetIndex);
    std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
    _Rb_tree_const_iterator(&local_78,&stack0xffffffffffffff80);
    bVar1 = std::operator!=(&local_68,&local_78);
    if (!bVar1) {
      __assert_fail("tii != this->TargetIndex.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmComputeTargetDepends.cxx"
                    ,0x178,
                    "void cmComputeTargetDepends::AddTargetDepend(int, const cmGeneratorTarget *, const cmListFileBacktrace &, bool)"
                   );
    }
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_cmGeneratorTarget_*const,_int>_>::
             operator->(&local_68);
    local_84 = ppVar4->second;
    this_01 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
              std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                        (&(this->InitialGraph).
                          super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                         (long)dependee_local._4_4_);
    local_85 = (bool)((linking ^ 0xffU) & 1);
    std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
    emplace_back<int&,bool,cmListFileBacktrace_const&>
              (this_01,&local_84,&local_85,dependee_backtrace);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddTargetDepend(
  int depender_index, cmGeneratorTarget const* dependee,
  cmListFileBacktrace const& dependee_backtrace, bool linking)
{
  if (dependee->IsImported() ||
      dependee->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    // Skip IMPORTED and INTERFACE targets but follow their utility
    // dependencies.
    std::set<cmLinkItem> const& utils = dependee->GetUtilityItems();
    for (cmLinkItem const& i : utils) {
      if (cmGeneratorTarget const* transitive_dependee = i.Target) {
        this->AddTargetDepend(depender_index, transitive_dependee, i.Backtrace,
                              false);
      }
    }
  } else {
    // Lookup the index for this target.  All targets should be known by
    // this point.
    std::map<cmGeneratorTarget const*, int>::const_iterator tii =
      this->TargetIndex.find(dependee);
    assert(tii != this->TargetIndex.end());
    int dependee_index = tii->second;

    // Add this entry to the dependency graph.
    this->InitialGraph[depender_index].emplace_back(dependee_index, !linking,
                                                    dependee_backtrace);
  }
}